

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::Tailored::indicAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  long lVar1;
  bool *invalid_00;
  qsizetype qVar2;
  long in_RCX;
  long in_RDX;
  char16_t *in_RSI;
  long in_R8;
  long in_FS_OFFSET;
  qsizetype boundary;
  qsizetype i;
  qsizetype end;
  bool invalid;
  long local_48;
  long local_40;
  Script in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  invalid_00 = (bool *)(in_RDX + in_R8);
  local_40 = 0;
  while (local_40 < in_RCX) {
    in_stack_fffffffffffffff4 = CONCAT13(0xaa,(int3)in_stack_fffffffffffffff4);
    qVar2 = indic_nextSyllableBoundary(in_stack_fffffffffffffff4,in_RSI,in_RDX,in_RCX,invalid_00);
    local_48 = qVar2 - in_RDX;
    invalid_00[local_40] = (bool)(invalid_00[local_40] & 0xfeU | 1);
    if (in_RCX + -1 < local_48) {
      local_48 = in_RCX;
    }
    while (local_40 = local_40 + 1, local_40 < local_48) {
      invalid_00[local_40] = (bool)(invalid_00[local_40] & 0xfe);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void indicAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    attributes += from;
    qsizetype i = 0;
    while (i < len) {
        bool invalid;
        qsizetype boundary = indic_nextSyllableBoundary(script, text, from+i, end, &invalid) - from;
         attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }


}